

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isPossiblePattern(TokenKind kind)

{
  bool local_9;
  TokenKind kind_local;
  
  if ((kind == ApostropheOpenBrace) || (kind == DotStar || kind == Dot)) {
    local_9 = true;
  }
  else {
    local_9 = isPossibleExpression(kind);
  }
  return local_9;
}

Assistant:

bool SyntaxFacts::isPossiblePattern(TokenKind kind) {
    switch (kind) {
        case TokenKind::Dot:
        case TokenKind::DotStar:
        case TokenKind::ApostropheOpenBrace:
            return true;
        default:
            return isPossibleExpression(kind);
    }
}